

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::getDualObjectiveValue(Highs *this,double *dual_objective_function_value)

{
  bool bVar1;
  HighsStatus HVar2;
  long in_RDI;
  bool have_dual_objective_value;
  double *in_stack_00000038;
  HighsSolution *in_stack_00000040;
  HighsLp *in_stack_00000048;
  undefined1 local_11;
  
  local_11 = false;
  bVar1 = HighsModel::isQp((HighsModel *)(in_RDI + 0x138));
  if (!bVar1) {
    local_11 = computeDualObjectiveValue(in_stack_00000048,in_stack_00000040,in_stack_00000038);
  }
  HVar2 = kError;
  if (local_11 != false) {
    HVar2 = kOk;
  }
  return HVar2;
}

Assistant:

HighsStatus Highs::getDualObjectiveValue(
    double& dual_objective_function_value) const {
  bool have_dual_objective_value = false;
  if (!this->model_.isQp())
    have_dual_objective_value = computeDualObjectiveValue(
        model_.lp_, solution_, dual_objective_function_value);
  return have_dual_objective_value ? HighsStatus::kOk : HighsStatus::kError;
}